

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,int *retCodeOut)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  undefined7 in_register_00000011;
  int retCode;
  string output;
  int local_54;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    if (comment == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5d9768);
    }
    else {
      sVar2 = strlen(comment);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,comment,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":\n",2);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_50,command," ");
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_54 = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar1 = cmSystemTools::RunSingleCommand
                    (command,&local_50,&local_50,&local_54,(char *)0x0,OUTPUT_NONE,0.0);
  lVar4 = std::__cxx11::string::find((char *)&local_50,0x4c2d10,0);
  if ((lVar4 == -1) || (!bVar1 || local_54 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  }
  if (bVar1) {
    if (retCodeOut == (int *)0x0) {
      if (local_54 != 0) {
        if (comment == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5d9768);
        }
        else {
          sVar2 = strlen(comment);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,comment,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," failed. with ",0xe);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_54);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      bVar1 = local_54 == 0;
    }
    else {
      *retCodeOut = local_54;
      bVar1 = true;
    }
  }
  else {
    if (comment == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5d9768);
    }
    else {
      sVar2 = strlen(comment);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,comment,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," failed to run.",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

static bool RunCommand(const char* comment,
                       std::vector<std::string>& command,
                       bool verbose,
                       int* retCodeOut = 0)
{
  if(verbose)
    {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
    }
  std::string output;
  int retCode =0;
  // use rc command to create .res file
  bool res = cmSystemTools::RunSingleCommand(command,
                                             &output, &output,
                                             &retCode, 0,
                                             cmSystemTools::OUTPUT_NONE);
  // always print the output of the command, unless
  // it is the dumb rc command banner, but if the command
  // returned an error code then print the output anyway as
  // the banner may be mixed with some other important information.
  if(output.find("Resource Compiler Version") == output.npos
     || !res || retCode)
    {
    std::cout << output;
    }
  if (!res)
    {
    std::cout << comment << " failed to run." << std::endl;
    return false;
    }
  // if retCodeOut is requested then always return true
  // and set the retCodeOut to retCode
  if(retCodeOut)
    {
    *retCodeOut = retCode;
    return true;
    }
  if(retCode != 0)
    {
    std::cout << comment << " failed. with " << retCode << "\n";
    }
  return retCode == 0;
}